

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::PageSegmentBase
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,
          PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
          *allocator,bool committed,bool allocated,bool enableWriteBarrier)

{
  undefined1 *puVar1;
  PageBitVector *this_00;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  BVIndex BVar6;
  undefined8 *in_FS_OFFSET;
  
  SegmentBase<Memory::PreReservedVirtualAllocWrapper>::SegmentBase
            (&this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>,allocator,
             (ulong)allocator->maxAllocPageCount,enableWriteBarrier);
  this->decommitPageCount = 0;
  (this->freePages).data[0].word = 0;
  (this->freePages).data[1].word = 0;
  (this->freePages).data[2].word = 0;
  (this->freePages).data[3].word = 0;
  (this->freePages).data[4].word = 0;
  (this->decommitPages).data[0].word = 0;
  (this->decommitPages).data[1].word = 0;
  (this->decommitPages).data[2].word = 0;
  (this->decommitPages).data[3].word = 0;
  (this->decommitPages).data[4].word = 0;
  puVar1 = &(this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).field_0x2c;
  *puVar1 = *puVar1 | 4;
  if ((this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).segmentPageCount !=
      (ulong)(allocator->secondaryAllocPageCount + allocator->maxAllocPageCount)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xe0,
                       "(this->segmentPageCount == allocator->maxAllocPageCount + allocator->secondaryAllocPageCount)"
                       ,
                       "this->segmentPageCount == allocator->maxAllocPageCount + allocator->secondaryAllocPageCount"
                      );
    if (!bVar4) goto LAB_0027fb5d;
    *puVar2 = 0;
  }
  this_00 = &this->freePages;
  if (committed) {
    if (allocated) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xe6,"(!allocated)","!allocated");
      if (!bVar4) goto LAB_0027fb5d;
      *puVar2 = 0;
    }
    uVar5 = GetAvailablePageCount(this);
    this->freePageCount = uVar5;
    BVStatic<272UL>::SetRange(this_00,0,uVar5);
    BVar6 = this->freePageCount;
    if (BVar6 != 0x110) {
      BVStatic<272UL>::ClearRange(this_00,BVar6,0x110 - BVar6);
    }
    BVar6 = BVStatic<272UL>::Count(this_00);
    if (BVar6 != this->freePageCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xee,"(this->GetCountOfFreePages() == this->freePageCount)",
                         "this->GetCountOfFreePages() == this->freePageCount");
      if (!bVar4) {
LAB_0027fb5d:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar2 = 0;
    }
  }
  else {
    this->freePageCount = 0;
    (this->freePages).data[2].word = 0;
    (this->freePages).data[3].word = 0;
    this_00->data[0].word = 0;
    (this->freePages).data[1].word = 0;
    (this->freePages).data[4].word = 0;
    if (!allocated) {
      uVar5 = GetAvailablePageCount(this);
      this->decommitPageCount = uVar5;
      BVStatic<272UL>::SetRange(&this->decommitPages,0,uVar5);
      BVar6 = this->decommitPageCount;
      if (BVar6 != 0x110) {
        BVStatic<272UL>::ClearRange(&this->decommitPages,BVar6,0x110 - BVar6);
      }
    }
  }
  return;
}

Assistant:

PageSegmentBase<T>::PageSegmentBase(PageAllocatorBase<T> * allocator, bool committed, bool allocated, bool enableWriteBarrier) :
    SegmentBase<T>(allocator, allocator->maxAllocPageCount, enableWriteBarrier), decommitPageCount(0)
{
#if DBG
    this->isPageSegment = true;
#endif // DBG
    Assert(this->segmentPageCount == allocator->maxAllocPageCount + allocator->secondaryAllocPageCount);

    uint maxPageCount = GetMaxPageCount();

    if (committed)
    {
        Assert(!allocated);
        this->freePageCount = this->GetAvailablePageCount();
        this->SetRangeInFreePagesBitVector(0, this->freePageCount);
        if (this->freePageCount != maxPageCount)
        {
            this->ClearRangeInFreePagesBitVector(this->freePageCount, (maxPageCount - this->freePageCount));
        }

        Assert(this->GetCountOfFreePages() == this->freePageCount);
    }
    else
    {
        this->freePageCount = 0;
        this->ClearAllInFreePagesBitVector();
        if (!allocated)
        {
            this->decommitPageCount = this->GetAvailablePageCount();
            this->SetRangeInDecommitPagesBitVector(0, this->decommitPageCount);

            if (this->decommitPageCount != maxPageCount)
            {
                this->ClearRangeInDecommitPagesBitVector(this->decommitPageCount, (maxPageCount - this->decommitPageCount));
            }
        }
    }
}